

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void mi_stat_print_ex(mi_stat_count_t *stat,char *msg,int64_t unit,mi_output_fun *out,void *arg,
                     char *notok)

{
  char *pcVar1;
  char *fmt;
  int64_t n;
  
  _mi_fprintf(mi_buffered_out,out,"%10s:");
  if (unit == 0) {
    mi_print_amount(stat->peak,1,out,msg);
    mi_print_amount(stat->total,1,out,msg);
    pcVar1 = " ";
    _mi_fprintf(mi_buffered_out,out,"%11s");
    mi_print_amount(stat->current,1,out,pcVar1);
  }
  else {
    if (unit < 1) {
      mi_print_amount(stat->peak,-1,out,msg);
      mi_print_amount(stat->total,-1,out,msg);
      mi_print_amount(stat->current,-1,out,msg);
      if (unit == -1) {
        fmt = "%24s";
        pcVar1 = "";
        goto LAB_00407614;
      }
      n = 0;
      mi_print_amount(0,1,out,msg);
      mi_print_amount(n,0,out,msg);
    }
    else {
      mi_print_amount(stat->peak,1,out,msg);
      mi_print_amount(stat->total,1,out,msg);
      mi_print_amount(stat->current,1,out,msg);
      mi_print_amount(1,1,out,msg);
      fmt = "%12s";
      pcVar1 = " ";
LAB_00407614:
      _mi_fprintf(mi_buffered_out,out,fmt,pcVar1);
    }
    if (stat->current == 0) {
      pcVar1 = "  ok\n";
      goto LAB_0040770d;
    }
    _mi_fprintf(mi_buffered_out,out,"  ");
    pcVar1 = "not all freed";
    if (arg != (void *)0x0) {
      pcVar1 = (char *)arg;
    }
    _mi_fprintf(mi_buffered_out,out,pcVar1);
  }
  pcVar1 = "\n";
LAB_0040770d:
  _mi_fprintf(mi_buffered_out,out,pcVar1);
  return;
}

Assistant:

static void mi_stat_print_ex(const mi_stat_count_t* stat, const char* msg, int64_t unit, mi_output_fun* out, void* arg, const char* notok ) {
  _mi_fprintf(out, arg,"%10s:", msg);
  if (unit != 0) {
    if (unit > 0) {
      mi_print_amount(stat->peak, unit, out, arg);
      mi_print_amount(stat->total, unit, out, arg);
      // mi_print_amount(stat->freed, unit, out, arg);
      mi_print_amount(stat->current, unit, out, arg);
      mi_print_amount(unit, 1, out, arg);
      mi_print_count(stat->total, unit, out, arg);
    }
    else {
      mi_print_amount(stat->peak, -1, out, arg);
      mi_print_amount(stat->total, -1, out, arg);
      // mi_print_amount(stat->freed, -1, out, arg);
      mi_print_amount(stat->current, -1, out, arg);
      if (unit == -1) {
        _mi_fprintf(out, arg, "%24s", "");
      }
      else {
        mi_print_amount(-unit, 1, out, arg);
        mi_print_count((stat->total / -unit), 0, out, arg);
      }
    }
    if (stat->current != 0) {
      _mi_fprintf(out, arg, "  ");
      _mi_fprintf(out, arg, (notok == NULL ? "not all freed" : notok));
      _mi_fprintf(out, arg, "\n");
    }
    else {
      _mi_fprintf(out, arg, "  ok\n");
    }
  }
  else {
    mi_print_amount(stat->peak, 1, out, arg);
    mi_print_amount(stat->total, 1, out, arg);
    _mi_fprintf(out, arg, "%11s", " ");  // no freed
    mi_print_amount(stat->current, 1, out, arg);
    _mi_fprintf(out, arg, "\n");
  }
}